

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O0

Statement *
slang::ast::ConcurrentAssertionStatement::fromSyntax
          (Compilation *compilation,ConcurrentAssertionStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange sourceRange_01;
  SourceRange sourceRange_02;
  SourceRange range;
  bool bVar1;
  int iVar2;
  SourceLocation args_1;
  PropertySpecSyntax *pPVar3;
  undefined4 extraout_var;
  ActionBlockSyntax *pAVar4;
  undefined4 extraout_var_00;
  SyntaxNode *this;
  StatementSyntax *pSVar5;
  undefined4 extraout_var_01;
  ConcurrentAssertionStatement *pCVar6;
  socklen_t in_ECX;
  socklen_t __len;
  SourceLocation in_RDX;
  SyntaxKind *in_RSI;
  Compilation *in_RDI;
  ConcurrentAssertionStatement *result;
  bool isCover;
  Statement *ifFalse;
  Statement *ifTrue;
  bool bad;
  AssertionExpr *prop;
  ASTContext ctx;
  ProceduralBlockSymbol *proc;
  AssertionKind assertKind;
  ASTContext *in_stack_fffffffffffffe88;
  Compilation *in_stack_fffffffffffffe90;
  Compilation *compilation_00;
  bitmask<slang::ast::ASTFlags> *in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  ASTContext *in_stack_fffffffffffffea8;
  SourceLocation in_stack_fffffffffffffeb0;
  SourceLocation in_stack_fffffffffffffeb8;
  AssertionKind *in_stack_fffffffffffffec8;
  Diagnostic *in_stack_fffffffffffffed0;
  string_view in_stack_fffffffffffffed8;
  SyntaxNode *this_00;
  Statement *local_e0;
  Statement *local_d8;
  bitmask<slang::ast::ASTFlags> local_d0;
  byte local_c1;
  AssertionExpr *local_c0;
  ASTContext local_b8;
  SourceRange local_80;
  undefined4 local_6c;
  ProceduralBlockSymbol *local_68;
  AssertionKind local_5c;
  string_view local_58;
  SourceRange local_48;
  undefined4 local_34;
  bitmask<slang::ast::ASTFlags> local_30;
  socklen_t local_28;
  SourceLocation local_20;
  SyntaxKind *local_18;
  Compilation *local_10;
  ConcurrentAssertionStatement *local_8;
  
  args_1 = (SourceLocation)((long)in_RDX + 0x10);
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = in_ECX;
  bitmask<slang::ast::ASTFlags>::bitmask(&local_30,ConcurrentAssertActionBlock);
  bVar1 = bitmask<slang::ast::ASTFlags>::has
                    ((bitmask<slang::ast::ASTFlags> *)
                     CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                     in_stack_fffffffffffffe98);
  this_00 = (SyntaxNode *)in_stack_fffffffffffffed8._M_str;
  if (bVar1) {
    local_34 = 0xe0008;
    local_48 = slang::syntax::SyntaxNode::sourceRange(this_00);
    sourceRange.endLoc = in_stack_fffffffffffffeb8;
    sourceRange.startLoc = local_20;
    ASTContext::addDiag(in_stack_fffffffffffffea8,args_1._4_4_,sourceRange);
    local_58 = parsing::Token::valueText
                         ((Token *)CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    Diagnostic::operator<<(in_stack_fffffffffffffed0,in_stack_fffffffffffffed8);
    local_8 = (ConcurrentAssertionStatement *)
              Statement::badStmt(in_stack_fffffffffffffe90,(Statement *)in_stack_fffffffffffffe88);
  }
  else {
    local_5c = SemanticFacts::getAssertKind(*local_18);
    local_68 = ASTContext::getProceduralBlock(in_stack_fffffffffffffe88);
    if ((local_5c == Expect) ||
       ((local_68 != (ProceduralBlockSymbol *)0x0 && (local_68->procedureKind != Final)))) {
      memcpy(&local_b8,(void *)local_20,0x38);
      ASTContext::clearInstanceAndProc(&local_b8);
      pPVar3 = not_null<slang::syntax::PropertySpecSyntax_*>::operator*
                         ((not_null<slang::syntax::PropertySpecSyntax_*> *)0xc09ffe);
      iVar2 = AssertionExpr::bind((int)pPVar3,(sockaddr *)&local_b8,__len);
      local_c0 = (AssertionExpr *)CONCAT44(extraout_var,iVar2);
      local_c1 = AssertionExpr::bad(local_c0);
      bitmask<slang::ast::ASTFlags>::bitmask(&local_d0,ConcurrentAssertActionBlock);
      bitmask<slang::ast::ASTFlags>::operator|=(&local_b8.flags,&local_d0);
      local_d8 = (Statement *)0x0;
      local_e0 = (Statement *)0x0;
      pAVar4 = not_null<slang::syntax::ActionBlockSyntax_*>::operator->
                         ((not_null<slang::syntax::ActionBlockSyntax_*> *)0xc0a083);
      if (pAVar4->statement != (StatementSyntax *)0x0) {
        pAVar4 = not_null<slang::syntax::ActionBlockSyntax_*>::operator->
                           ((not_null<slang::syntax::ActionBlockSyntax_*> *)0xc0a09e);
        iVar2 = Statement::bind((int)pAVar4->statement,(sockaddr *)&local_b8,local_28);
        local_d8 = (Statement *)CONCAT44(extraout_var_00,iVar2);
      }
      pAVar4 = not_null<slang::syntax::ActionBlockSyntax_*>::operator->
                         ((not_null<slang::syntax::ActionBlockSyntax_*> *)0xc0a0d9);
      if (pAVar4->elseClause != (ElseClauseSyntax *)0x0) {
        not_null<slang::syntax::ActionBlockSyntax_*>::operator->
                  ((not_null<slang::syntax::ActionBlockSyntax_*> *)0xc0a0f4);
        this = not_null<slang::syntax::SyntaxNode_*>::operator->
                         ((not_null<slang::syntax::SyntaxNode_*> *)0xc0a101);
        pSVar5 = slang::syntax::SyntaxNode::as<slang::syntax::StatementSyntax>(this);
        iVar2 = Statement::bind((int)pSVar5,(sockaddr *)&local_b8,local_28);
        local_e0 = (Statement *)CONCAT44(extraout_var_01,iVar2);
      }
      if ((local_5c == CoverProperty || local_5c == CoverSequence) && (local_e0 != (Statement *)0x0)
         ) {
        not_null<slang::syntax::ActionBlockSyntax_*>::operator->
                  ((not_null<slang::syntax::ActionBlockSyntax_*> *)0xc0a191);
        slang::syntax::SyntaxNode::sourceRange(this_00);
        sourceRange_01.endLoc = in_stack_fffffffffffffeb8;
        sourceRange_01.startLoc = in_stack_fffffffffffffeb0;
        ASTContext::addDiag(in_stack_fffffffffffffea8,args_1._4_4_,sourceRange_01);
        local_c1 = 1;
      }
      else if ((local_5c == Restrict) &&
              ((local_e0 != (Statement *)0x0 ||
               ((local_d8 != (Statement *)0x0 && (local_d8->kind != Empty)))))) {
        not_null<slang::syntax::ActionBlockSyntax_*>::operator->
                  ((not_null<slang::syntax::ActionBlockSyntax_*> *)0xc0a226);
        slang::syntax::SyntaxNode::sourceRange(this_00);
        sourceRange_02.endLoc = in_stack_fffffffffffffeb8;
        sourceRange_02.startLoc = in_stack_fffffffffffffeb0;
        ASTContext::addDiag(in_stack_fffffffffffffea8,args_1._4_4_,sourceRange_02);
        local_c1 = 1;
      }
      slang::syntax::SyntaxNode::sourceRange(this_00);
      pCVar6 = BumpAllocator::
               emplace<slang::ast::ConcurrentAssertionStatement,slang::ast::AssertionKind&,slang::ast::AssertionExpr_const&,slang::ast::Statement_const*&,slang::ast::Statement_const*&,slang::SourceRange>
                         ((BumpAllocator *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                          (AssertionExpr *)args_1,(Statement **)in_stack_fffffffffffffeb8,
                          (Statement **)in_stack_fffffffffffffeb0,
                          (SourceRange *)in_stack_fffffffffffffea8);
      compilation_00 = local_10;
      if ((((local_c1 & 1) != 0) ||
          ((local_d8 != (Statement *)0x0 &&
           (bVar1 = Statement::bad(local_d8), compilation_00 = local_10, bVar1)))) ||
         ((local_e0 != (Statement *)0x0 && (bVar1 = Statement::bad(local_e0), bVar1)))) {
        local_8 = (ConcurrentAssertionStatement *)
                  Statement::badStmt(compilation_00,(Statement *)in_stack_fffffffffffffe88);
      }
      else {
        local_8 = pCVar6;
        if ((local_5c == Expect) &&
           (range.endLoc = (pCVar6->super_Statement).sourceRange.startLoc, range.startLoc = args_1,
           bVar1 = ASTContext::requireTimingAllowed((ASTContext *)in_stack_fffffffffffffeb8,range),
           !bVar1)) {
          local_8 = (ConcurrentAssertionStatement *)
                    Statement::badStmt(compilation_00,(Statement *)in_stack_fffffffffffffe88);
        }
      }
    }
    else {
      local_6c = 0xf0008;
      local_80 = slang::syntax::SyntaxNode::sourceRange(this_00);
      sourceRange_00.endLoc = in_stack_fffffffffffffeb8;
      sourceRange_00.startLoc = in_stack_fffffffffffffeb0;
      ASTContext::addDiag((ASTContext *)local_20,args_1._4_4_,sourceRange_00);
      local_8 = (ConcurrentAssertionStatement *)
                Statement::badStmt(in_stack_fffffffffffffe90,(Statement *)in_stack_fffffffffffffe88)
      ;
    }
  }
  return &local_8->super_Statement;
}

Assistant:

Statement& ConcurrentAssertionStatement::fromSyntax(
    Compilation& compilation, const ConcurrentAssertionStatementSyntax& syntax,
    const ASTContext& context, StatementContext& stmtCtx) {

    if (context.flags.has(ASTFlags::ConcurrentAssertActionBlock)) {
        context.addDiag(diag::ConcurrentAssertActionBlock, syntax.sourceRange())
            << syntax.keyword.valueText();
        return badStmt(compilation, nullptr);
    }

    AssertionKind assertKind = SemanticFacts::getAssertKind(syntax.kind);

    auto proc = context.getProceduralBlock();
    if (assertKind != AssertionKind::Expect &&
        (!proc || proc->procedureKind == ProceduralBlockKind::Final)) {
        context.addDiag(diag::ConcurrentAssertNotInProc, syntax.sourceRange());
        return badStmt(compilation, nullptr);
    }

    ASTContext ctx = context;
    ctx.clearInstanceAndProc();

    auto& prop = AssertionExpr::bind(*syntax.propertySpec, ctx);
    bool bad = prop.bad();

    ctx.flags |= ASTFlags::ConcurrentAssertActionBlock;
    const Statement* ifTrue = nullptr;
    const Statement* ifFalse = nullptr;
    if (syntax.action->statement)
        ifTrue = &Statement::bind(*syntax.action->statement, ctx, stmtCtx);

    if (syntax.action->elseClause) {
        ifFalse = &Statement::bind(syntax.action->elseClause->clause->as<StatementSyntax>(), ctx,
                                   stmtCtx);
    }

    const bool isCover = assertKind == AssertionKind::CoverProperty ||
                         assertKind == AssertionKind::CoverSequence;
    if (isCover && ifFalse) {
        ctx.addDiag(diag::CoverStmtNoFail, syntax.action->elseClause->sourceRange());
        bad = true;
    }
    else if (assertKind == AssertionKind::Restrict &&
             (ifFalse || (ifTrue && ifTrue->kind != StatementKind::Empty))) {
        ctx.addDiag(diag::RestrictStmtNoFail, syntax.action->sourceRange());
        bad = true;
    }

    auto result = compilation.emplace<ConcurrentAssertionStatement>(assertKind, prop, ifTrue,
                                                                    ifFalse, syntax.sourceRange());
    if (bad || (ifTrue && ifTrue->bad()) || (ifFalse && ifFalse->bad()))
        return badStmt(compilation, result);

    if (assertKind == AssertionKind::Expect && !context.requireTimingAllowed(result->sourceRange))
        return badStmt(compilation, result);

    return *result;
}